

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O2

error assemble_half_float_immediate
                (context *ctx,token *token,opcode *op,int bits,int offset,int neg_bit)

{
  uint32_t uVar1;
  long lVar2;
  long lVar3;
  uint16_t uVar4;
  int iVar5;
  ulong uVar6;
  undefined4 in_register_0000000c;
  int in_stack_00000008;
  token local_58;
  
  uVar1 = op[1].reuse;
  switch(uVar1) {
  case 1:
  case 6:
  case 7:
    if (uVar1 != 1) {
      context::tokenize(&local_58,(context *)token);
      *(int *)&op[2].value = local_58.column;
      op[1].value = (uint64_t)local_58.data.string._M_str;
      op[1].reuse = local_58.type;
      op[1].sched = (anon_union_4_2_f99a8bb9_for_sched)local_58.line;
      op->value = (uint64_t)local_58.filename;
      op->reuse = local_58.data.predicate.index;
      op->sched = (anon_union_4_2_f99a8bb9_for_sched)local_58.data.predicate.negated;
    }
    iVar5 = equal((token *)op,"QNAN");
    uVar6 = 0x7fff;
    if (iVar5 == 0) {
      iVar5 = equal((token *)op,"INF");
      uVar6 = 0x7c00;
      if (iVar5 == 0) goto switchD_0012a1e4_caseD_2;
    }
    if (uVar1 != 7) goto LAB_0012a2c2;
    if (in_stack_00000008 < 0) {
      uVar6 = (ulong)((uint)uVar6 | 0x8000);
      goto LAB_0012a2c2;
    }
    break;
  default:
switchD_0012a1e4_caseD_2:
    fail((token *)ctx,(char *)op,"expected floating-point literal, QNAN, or INF");
    return (unique_ptr<char[],_std::default_delete<char[]>_>)
           (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
  case 4:
    lVar2._0_4_ = op->reuse;
    lVar2._4_4_ = op->sched;
    uVar4 = fp32_to_fp16<(std::float_round_style)1>((float)lVar2);
    uVar6 = (ulong)uVar4;
    if ((in_stack_00000008 < 0) || (lVar3._0_4_ = op->reuse, lVar3._4_4_ = op->sched, -1 < lVar3))
    goto LAB_0012a2c2;
    break;
  case 5:
    uVar4 = fp32_to_fp16<(std::float_round_style)1>((float)*(double *)&op->reuse);
    uVar6 = (ulong)uVar4;
    if ((in_stack_00000008 < 0) || (0.0 < *(double *)&op->reuse || *(double *)&op->reuse == 0.0))
    goto LAB_0012a2c2;
  }
  opcode::add_bits((opcode *)CONCAT44(in_register_0000000c,bits),
                   1L << ((byte)in_stack_00000008 & 0x3f));
LAB_0012a2c2:
  if (offset != 0x10) {
    if (offset != 9) {
      __assert_fail("false && \"invalid bits\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/helper.cpp"
                    ,300,
                    "error assemble_half_float_immediate(context &, token &, opcode &, int, int, int)"
                   );
    }
    uVar6 = (ulong)((uint)(uVar6 >> 6) & 0x1ff);
  }
  opcode::add_bits((opcode *)CONCAT44(in_register_0000000c,bits),uVar6 << ((byte)neg_bit & 0x3f));
  context::tokenize(&local_58,(context *)token);
  *(int *)&op[2].value = local_58.column;
  op[1].value = (uint64_t)local_58.data.string._M_str;
  op[1].reuse = local_58.type;
  op[1].sched = (anon_union_4_2_f99a8bb9_for_sched)local_58.line;
  op->value = (uint64_t)local_58.filename;
  op->reuse = local_58.data.predicate.index;
  op->sched = (anon_union_4_2_f99a8bb9_for_sched)local_58.data.predicate.negated;
  ctx->pc = 0;
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

error assemble_half_float_immediate(context& ctx, token& token, opcode& op, int bits, int offset,
                                    int neg_bit)
{
    static constexpr char MESSAGE[] = "expected floating-point literal, QNAN, or INF";

    uint16_t value;
    switch (token.type) {
    case token_type::float_immediate:
        value = fp32_to_fp16(token.data.float_immediate);
        if (token.data.float_immediate < 0 && neg_bit >= 0) {
            op.add_bits(1ULL << neg_bit);
        }
        break;
    case token_type::immediate:
        value = fp32_to_fp16(static_cast<float>(token.data.immediate));
        if (token.data.immediate < 0 && neg_bit >= 0) {
            op.add_bits(1ULL << neg_bit);
        }
        break;
    case token_type::plus:
    case token_type::minus:
    case token_type::identifier: {
        const bool negate = token.type == token_type::minus;
        if (token.type != token_type::identifier) {
            token = ctx.tokenize();
        }
        if (equal(token, "QNAN")) {
            value = 0x7fff;
        } else if (equal(token, "INF")) {
            value = 0x7c00;
        } else {
            return fail(token, MESSAGE);
        }
        if (negate) {
            if (neg_bit >= 0) {
                op.add_bits(1ULL << neg_bit);
            } else {
                value |= 0x8000;
            }
        }
        break;
    }
    default:
        return fail(token, MESSAGE);
    }
    if (bits == 9) {
        // TODO: add a setting to warn/error precision losses
        op.add_bits(static_cast<uint64_t>(static_cast<uint16_t>(value << 1) >> 7) << offset);
    } else if (bits == 16) {
        op.add_bits(static_cast<uint64_t>(value) << offset);
    } else {
        assert(false && "invalid bits");
    }
    token = ctx.tokenize();
    return {};
}